

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O2

ion_status_t sl_delete(ion_skiplist_t *skiplist,ion_key_t key)

{
  ion_key_size_t iVar1;
  sl_node *psVar2;
  sl_node *psVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ion_sl_node_t *piVar8;
  ion_sl_node_t *piVar9;
  ulong uVar10;
  
  iVar1 = (skiplist->super).record.key_size;
  piVar9 = skiplist->head;
  uVar7 = piVar9->height;
  uVar6 = 0;
  uVar10 = 1;
  do {
    if ((int)uVar7 < 0) {
      return (ion_status_t)(uVar10 | (ulong)uVar6 << 0x20);
    }
    psVar2 = piVar9;
    do {
      piVar9 = psVar2;
      if (piVar9->next[uVar7] == (sl_node *)0x0) goto LAB_001061b6;
      cVar4 = (*(skiplist->super).compare)(piVar9->next[uVar7]->key,key,iVar1);
      psVar2 = piVar9->next[uVar7];
    } while (cVar4 < '\0');
    if ((psVar2 != (sl_node *)0x0) &&
       (cVar4 = (*(skiplist->super).compare)(psVar2->key,key,iVar1), cVar4 == '\0')) {
      while ((piVar9->next[uVar7] != (sl_node *)0x0 &&
             (cVar4 = (*(skiplist->super).compare)(piVar9->next[uVar7]->key,key,iVar1),
             cVar4 == '\0'))) {
        psVar2 = piVar9->next[uVar7];
        piVar8 = piVar9;
        for (uVar5 = psVar2->height; -1 < (int)uVar5; uVar5 = uVar5 - 1) {
          psVar3 = piVar8;
          do {
            piVar8 = psVar3;
            psVar3 = piVar8->next[uVar5];
          } while (psVar3 != psVar2);
          piVar8->next[uVar5] = psVar2->next[uVar5];
        }
        free(psVar2->key);
        free(psVar2->value);
        free(psVar2->next);
        free(psVar2);
        uVar6 = uVar6 + 1;
      }
      uVar10 = 0;
    }
LAB_001061b6:
    uVar7 = uVar7 - 1;
  } while( true );
}

Assistant:

ion_status_t
sl_delete(
	ion_skiplist_t	*skiplist,
	ion_key_t		key
) {
	ion_key_size_t key_size = skiplist->super.record.key_size;
	/* Default return is no item */
	ion_status_t status;

	status			= ION_STATUS_INITIALIZE;
	/* If we fall through, then we didn't find what we were looking for. */
	status.error	= err_item_not_found;

	ion_sl_node_t	*cursor = skiplist->head;
	ion_sl_level_t	h;

	for (h = skiplist->head->height; h >= 0; --h) {
		while (NULL != cursor->next[h] && skiplist->super.compare(cursor->next[h]->key, key, key_size) < 0) {
			cursor = cursor->next[h];
		}

		if ((NULL != cursor->next[h]) && (skiplist->super.compare(cursor->next[h]->key, key, key_size) == 0)) {
			ion_sl_node_t *oldcursor = cursor;

			while (NULL != cursor->next[h] && skiplist->super.compare(cursor->next[h]->key, key, key_size) == 0) {
				ion_sl_node_t	*tofree = cursor->next[h];
				ion_sl_node_t	*relink = cursor->next[h];
				ion_sl_level_t	link_h	= relink->height;

				while (link_h >= 0) {
					while (cursor->next[link_h] != relink) {
						cursor = cursor->next[link_h];
					}

					ion_sl_node_t *jump = relink->next[link_h];

					cursor->next[link_h] = jump;
					link_h--;
				}

				free(tofree->key);
				free(tofree->value);
				free(tofree->next);
				free(tofree);

				cursor = oldcursor;
				status.count++;
			}

			status.error = err_ok;
		}
	}

	return status;
}